

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O2

void relational_suite::run(void)

{
  compare_null_with_null();
  compare_null_with_null_literal();
  compare_null_with_boolean();
  compare_null_with_boolean_literal();
  compare_null_with_integer();
  compare_null_with_integer_literal();
  compare_null_with_real();
  compare_null_with_real_literal();
  compare_null_with_string();
  compare_null_with_wstring();
  compare_null_with_u16string();
  compare_null_with_u32string();
  compare_null_with_array();
  compare_null_with_map();
  compare_boolean_with_null();
  compare_boolean_with_null_literal();
  compare_boolean_with_boolean();
  compare_boolean_with_boolean_literal();
  compare_boolean_with_integer();
  compare_boolean_with_integer_literal();
  compare_boolean_with_real();
  compare_boolean_with_real_literal();
  compare_boolean_with_string();
  compare_boolean_with_wstring();
  compare_boolean_with_u16string();
  compare_boolean_with_u32string();
  compare_boolean_with_array();
  compare_boolean_with_map();
  compare_integer_with_null();
  compare_integer_with_null_literal();
  compare_integer_with_boolean();
  compare_integer_with_boolean_literal();
  compare_integer_with_integer();
  compare_integer_with_integer_literal();
  compare_integer_with_real();
  compare_integer_with_real_literal();
  compare_integer_with_string();
  compare_integer_with_wstring();
  compare_integer_with_u16string();
  compare_integer_with_u32string();
  compare_integer_with_array();
  compare_integer_with_map();
  compare_real_with_null();
  compare_real_with_null_literal();
  compare_real_with_boolean();
  compare_real_with_boolean_literal();
  compare_real_with_integer();
  compare_real_with_integer_literal();
  compare_real_with_real();
  compare_real_with_real_literal();
  compare_real_with_string();
  compare_real_with_wstring();
  compare_real_with_u16string();
  compare_real_with_u32string();
  compare_real_with_array();
  compare_real_with_map();
  compare_string_with_null();
  compare_string_with_null_literal();
  compare_string_with_boolean();
  compare_string_with_boolean_literal();
  compare_string_with_integer();
  compare_string_with_real();
  compare_string_with_string();
  compare_string_with_string_literal();
  compare_string_with_wstring();
  compare_string_with_wstring_literal();
  compare_string_with_u16string();
  compare_string_with_u16string_literal();
  compare_string_with_u32string();
  compare_string_with_u32string_literal();
  compare_string_with_array();
  compare_string_with_map();
  compare_wstring_with_null();
  compare_wstring_with_null_literal();
  compare_wstring_with_boolean();
  compare_wstring_with_boolean_literal();
  compare_wstring_with_integer();
  compare_wstring_with_real();
  compare_wstring_with_string();
  compare_wstring_with_string_literal();
  compare_wstring_with_wstring();
  compare_wstring_with_wstring_literal();
  compare_wstring_with_u16string();
  compare_wstring_with_u16string_literal();
  compare_wstring_with_u32string();
  compare_wstring_with_u32string_literal();
  compare_wstring_with_array();
  compare_wstring_with_map();
  compare_u16string_with_null();
  compare_u16string_with_null_literal();
  compare_u16string_with_boolean();
  compare_u16string_with_boolean_literal();
  compare_u16string_with_integer();
  compare_u16string_with_real();
  compare_u16string_with_string();
  compare_u16string_with_string_literal();
  compare_u16string_with_wstring();
  compare_u16string_with_wstring_literal();
  compare_u16string_with_u16string();
  compare_u16string_with_u16string_literal();
  compare_u16string_with_u32string();
  compare_u16string_with_u32string_literal();
  compare_u16string_with_array();
  compare_u16string_with_map();
  compare_u32string_with_null();
  compare_u32string_with_null_literal();
  compare_u32string_with_boolean();
  compare_u32string_with_boolean_literal();
  compare_u32string_with_integer();
  compare_u32string_with_real();
  compare_u32string_with_string();
  compare_u32string_with_string_literal();
  compare_u32string_with_wstring();
  compare_u32string_with_wstring_literal();
  compare_u32string_with_u16string();
  compare_u32string_with_u16string_literal();
  compare_u32string_with_u32string();
  compare_u32string_with_u32string_literal();
  compare_u32string_with_array();
  compare_u32string_with_map();
  compare_array_with_array();
  compare_map_with_null();
  compare_map_with_map_null();
  compare_map_with_map_boolean();
  compare_map_with_map_integer();
  compare_map_with_map_real();
  compare_map_with_map_string();
  compare_map_with_map_wstring();
  compare_map_with_map_u16string();
  compare_map_with_map_u32string();
  return;
}

Assistant:

void run()
{
    compare_null_with_null();
    compare_null_with_null_literal();
    compare_null_with_boolean();
    compare_null_with_boolean_literal();
    compare_null_with_integer();
    compare_null_with_integer_literal();
    compare_null_with_real();
    compare_null_with_real_literal();
    compare_null_with_string();
    compare_null_with_wstring();
    compare_null_with_u16string();
    compare_null_with_u32string();
    compare_null_with_array();
    compare_null_with_map();

    compare_boolean_with_null();
    compare_boolean_with_null_literal();
    compare_boolean_with_boolean();
    compare_boolean_with_boolean_literal();
    compare_boolean_with_integer();
    compare_boolean_with_integer_literal();
    compare_boolean_with_real();
    compare_boolean_with_real_literal();
    compare_boolean_with_string();
    compare_boolean_with_wstring();
    compare_boolean_with_u16string();
    compare_boolean_with_u32string();
    compare_boolean_with_array();
    compare_boolean_with_map();

    compare_integer_with_null();
    compare_integer_with_null_literal();
    compare_integer_with_boolean();
    compare_integer_with_boolean_literal();
    compare_integer_with_integer();
    compare_integer_with_integer_literal();
    compare_integer_with_real();
    compare_integer_with_real_literal();
    compare_integer_with_string();
    compare_integer_with_wstring();
    compare_integer_with_u16string();
    compare_integer_with_u32string();
    compare_integer_with_array();
    compare_integer_with_map();

    // FIXME: Real with NaN etc.
    compare_real_with_null();
    compare_real_with_null_literal();
    compare_real_with_boolean();
    compare_real_with_boolean_literal();
    compare_real_with_integer();
    compare_real_with_integer_literal();
    compare_real_with_real();
    compare_real_with_real_literal();
    compare_real_with_string();
    compare_real_with_wstring();
    compare_real_with_u16string();
    compare_real_with_u32string();
    compare_real_with_array();
    compare_real_with_map();

    compare_string_with_null();
    compare_string_with_null_literal();
    compare_string_with_boolean();
    compare_string_with_boolean_literal();
    compare_string_with_integer();
    compare_string_with_real();
    compare_string_with_string();
    compare_string_with_string_literal();
    compare_string_with_wstring();
    compare_string_with_wstring_literal();
    compare_string_with_u16string();
    compare_string_with_u16string_literal();
    compare_string_with_u32string();
    compare_string_with_u32string_literal();
    compare_string_with_array();
    compare_string_with_map();

    compare_wstring_with_null();
    compare_wstring_with_null_literal();
    compare_wstring_with_boolean();
    compare_wstring_with_boolean_literal();
    compare_wstring_with_integer();
    compare_wstring_with_real();
    compare_wstring_with_string();
    compare_wstring_with_string_literal();
    compare_wstring_with_wstring();
    compare_wstring_with_wstring_literal();
    compare_wstring_with_u16string();
    compare_wstring_with_u16string_literal();
    compare_wstring_with_u32string();
    compare_wstring_with_u32string_literal();
    compare_wstring_with_array();
    compare_wstring_with_map();

    compare_u16string_with_null();
    compare_u16string_with_null_literal();
    compare_u16string_with_boolean();
    compare_u16string_with_boolean_literal();
    compare_u16string_with_integer();
    compare_u16string_with_real();
    compare_u16string_with_string();
    compare_u16string_with_string_literal();
    compare_u16string_with_wstring();
    compare_u16string_with_wstring_literal();
    compare_u16string_with_u16string();
    compare_u16string_with_u16string_literal();
    compare_u16string_with_u32string();
    compare_u16string_with_u32string_literal();
    compare_u16string_with_array();
    compare_u16string_with_map();

    compare_u32string_with_null();
    compare_u32string_with_null_literal();
    compare_u32string_with_boolean();
    compare_u32string_with_boolean_literal();
    compare_u32string_with_integer();
    compare_u32string_with_real();
    compare_u32string_with_string();
    compare_u32string_with_string_literal();
    compare_u32string_with_wstring();
    compare_u32string_with_wstring_literal();
    compare_u32string_with_u16string();
    compare_u32string_with_u16string_literal();
    compare_u32string_with_u32string();
    compare_u32string_with_u32string_literal();
    compare_u32string_with_array();
    compare_u32string_with_map();

    // FIXME: More
    compare_array_with_array();

    compare_map_with_null();
    compare_map_with_map_null();
    compare_map_with_map_boolean();
    compare_map_with_map_integer();
    compare_map_with_map_real();
    compare_map_with_map_string();
    compare_map_with_map_wstring();
    compare_map_with_map_u16string();
    compare_map_with_map_u32string();
}